

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

bool __thiscall QByteArray::isUpper(QByteArray *this)

{
  char *__first;
  bool bVar1;
  
  __first = (this->d).ptr;
  bVar1 = std::none_of<char_const*,bool(*)(char)>(__first,__first + (this->d).size,isLowerCaseAscii)
  ;
  return bVar1;
}

Assistant:

const T *data() const noexcept { return ptr; }